

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O2

void __thiscall
fmt::v9::dynamic_format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>::
emplace_arg<char>(dynamic_format_arg_store<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>
                  *this,char *arg)

{
  basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> arg_1;
  anon_union_16_16_d721ec3a_for_value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_1
  local_28;
  undefined4 local_18;
  
  local_18 = 8;
  local_28.long_long_value = (longlong)(byte)*arg;
  std::
  vector<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>,std::allocator<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>>>
  ::emplace_back<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>>
            ((vector<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>,std::allocator<fmt::v9::basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,char>>>>
              *)this,(basic_format_arg<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)
                     &local_28.string);
  return;
}

Assistant:

void emplace_arg(const T& arg) {
    data_.emplace_back(detail::make_arg<Context>(arg));
  }